

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

bool __thiscall Table::equals(Table *this,Table b)

{
  char cVar1;
  char cVar2;
  int local_20;
  int local_1c;
  int j;
  int i;
  Table *this_local;
  
  local_1c = 0;
  do {
    if (2 < local_1c) {
      return true;
    }
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      cVar1 = Cell::getNumber(this->table[local_1c] + local_20);
      cVar2 = Cell::getNumber(b.table[local_1c] + local_20);
      if (cVar1 != cVar2) {
        return false;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool Table::equals(Table b) {
    for (int i = 0; i < HEIGHT; i++){
        for (int j = 0; j < WIDTH; j++) {
            if (this->table[i][j].getNumber() != b.table[i][j].getNumber()) {
                return false;
            }
        }
    }
    return true;
}